

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O3

bool Function_Template::form2_Sum(SumForm2 Sum)

{
  byte value;
  uint32_t uVar1;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image input;
  uint32_t local_84;
  uint32_t local_80;
  uint32_t local_7c;
  ImageTemplate<unsigned_char> local_78;
  Image local_50;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_78,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_50,value,0,0,&local_78);
  local_78._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_78);
  Unit_Test::generateRoi(&local_50,(uint32_t *)&local_78,&local_7c,&local_80,&local_84);
  uVar1 = (*Sum)(&local_50,(uint32_t)local_78._vptr_ImageTemplate,local_7c,local_80,local_84);
  local_50._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_50);
  return uVar1 == local_80 * value * local_84;
}

Assistant:

bool form2_Sum(SumForm2 Sum)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image input = uniformImage( intensity );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        return Sum( input, roiX, roiY, roiWidth, roiHeight ) == intensity * roiWidth * roiHeight;
    }